

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

array_n<char,_3,_std::allocator<char>_> * __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::operator=
          (array_n<char,_3,_std::allocator<char>_> *this,
          array_n<char,_3,_std::allocator<char>_> *obj)

{
  uint uVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  long lVar5;
  array_n<char,_3,_std::allocator<char>_> local_30;
  
  array_n(&local_30,obj);
  for (lVar5 = 2; lVar5 != 5; lVar5 = lVar5 + 1) {
    uVar1 = this->_dims[lVar5 + -2];
    this->_dims[lVar5 + -2] = local_30._dims[lVar5 + -2];
    local_30._dims[lVar5 + -2] = uVar1;
  }
  pcVar3 = this->first;
  pcVar4 = this->last;
  this->first = local_30.first;
  this->last = local_30.last;
  pcVar2 = this->_array;
  this->_array = local_30._array;
  local_30._array = pcVar2;
  local_30.first = pcVar3;
  local_30.last = pcVar4;
  ~array_n(&local_30);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }